

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.h
# Opt level: O0

cmCommand * __thiscall cmTargetCompileOptionsCommand::Clone(cmTargetCompileOptionsCommand *this)

{
  cmCommand *this_00;
  cmTargetCompileOptionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x58);
  cmTargetCompileOptionsCommand((cmTargetCompileOptionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmTargetCompileOptionsCommand; }